

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfSubscriber.c
# Opt level: O1

void timerCb(sbfTimer timer,void *closure)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)gMessages;
  if (uVar3 == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = gTimeTotal / uVar3;
  }
  uVar2 = gTimeLow;
  if (gTimeLow == 0xffffffffffffffff) {
    uVar2 = 0;
  }
  printf("%u low=%llu average=%llu high=%llu\n",uVar3,uVar2,uVar1,gTimeHigh);
  fflush(_stdout);
  gMessages = 0;
  gTimeLow = 0xffffffffffffffff;
  gTimeTotal = 0;
  gTimeHigh = 0;
  return;
}

Assistant:

static void
timerCb (sbfTimer timer, void* closure)
{
    printf ("%u low=%llu average=%llu high=%llu" SBF_EOL,
            gMessages,
            gTimeLow == UINT64_MAX ? 0 : (unsigned long long)gTimeLow,
            gMessages == 0 ? 0 : (unsigned long long)gTimeTotal / gMessages,
            (unsigned long long)gTimeHigh);
    fflush (stdout);

    gMessages = 0;
    gTimeLow = UINT64_MAX;
    gTimeTotal = 0;
    gTimeHigh = 0;
}